

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HSet.cpp
# Opt level: O0

int __thiscall HSet::remove(HSet *this,char *__filename)

{
  uint uVar1;
  value_type vVar2;
  uint7 extraout_var;
  uint *puVar3;
  reference pvVar4;
  uint7 extraout_var_00;
  int iVar5;
  HighsInt last_entry;
  HighsInt pointer;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  value_type vVar6;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  undefined1 uVar7;
  
  iVar5 = (int)__filename;
  if ((this->setup_ & 1U) == 0) {
    setup((HSet *)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),
          (HighsInt)((ulong)this >> 0x20),(HighsInt)this,SUB81((ulong)__filename >> 0x18,0),
          (FILE *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
          SUB81((ulong)this >> 0x38,0),SUB81((ulong)this >> 0x30,0));
    if ((this->debug_ & 1U) != 0) {
      debug((HSet *)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8));
      this = (HSet *)((ulong)extraout_var << 8);
    }
    uVar7 = 0;
  }
  else if (iVar5 < 0) {
    uVar7 = 0;
  }
  else if (this->max_entry_ < iVar5) {
    uVar7 = 0;
    this = (HSet *)((ulong)__filename & 0xffffffff);
  }
  else {
    puVar3 = (uint *)std::vector<int,_std::allocator<int>_>::operator[](&this->pointer_,(long)iVar5)
    ;
    uVar1 = *puVar3;
    if (uVar1 == 0xffffffff) {
      uVar7 = 0;
      this = (HSet *)(ulong)uVar1;
    }
    else {
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&this->pointer_,(long)iVar5);
      *pvVar4 = -1;
      if ((int)uVar1 < this->count_ + -1) {
        pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                           (&this->entry_,(long)(this->count_ + -1));
        vVar2 = *pvVar4;
        vVar6 = vVar2;
        pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&this->entry_,(long)(int)uVar1);
        *pvVar4 = vVar2;
        puVar3 = (uint *)std::vector<int,_std::allocator<int>_>::operator[]
                                   (&this->pointer_,(long)vVar6);
        *puVar3 = uVar1;
      }
      this->count_ = this->count_ + -1;
      if ((this->debug_ & 1U) != 0) {
        debug((HSet *)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8));
        this = (HSet *)((ulong)extraout_var_00 << 8);
      }
      uVar7 = 1;
    }
  }
  return (int)CONCAT71((int7)((ulong)this >> 8),uVar7);
}

Assistant:

bool HSet::remove(const HighsInt entry) {
  if (!setup_) {
    setup(1, 0);
    if (debug_) debug();
    return false;
  }
  if (entry < min_entry) return false;
  if (entry > max_entry_) return false;
  HighsInt pointer = pointer_[entry];
  if (pointer == no_pointer) return false;
  pointer_[entry] = no_pointer;
  if (pointer < count_ - 1) {
    HighsInt last_entry = entry_[count_ - 1];
    entry_[pointer] = last_entry;
    pointer_[last_entry] = pointer;
  }
  count_--;
  if (debug_) debug();
  return true;
}